

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall deqp::egl::Image::ImageTests::addCreateAndroidNativeActions(ImageTests *this)

{
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"android_native_rgb565",&local_29);
  addCreateAndroidNative(this,&local_28,0x8d62);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"android_native_rgb8",&local_29);
  addCreateAndroidNative(this,&local_28,0x8051);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"android_native_rgba4",&local_29);
  addCreateAndroidNative(this,&local_28,0x8056);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"android_native_rgb5_a1",&local_29);
  addCreateAndroidNative(this,&local_28,0x8057);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"android_native_rgba8",&local_29);
  addCreateAndroidNative(this,&local_28,0x8058);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void ImageTests::addCreateAndroidNativeActions (void)
{
	addCreateAndroidNative("android_native_rgb565",		GL_RGB565);
	addCreateAndroidNative("android_native_rgb8",		GL_RGB8);
	addCreateAndroidNative("android_native_rgba4",		GL_RGBA4);
	addCreateAndroidNative("android_native_rgb5_a1",	GL_RGB5_A1);
	addCreateAndroidNative("android_native_rgba8",		GL_RGBA8);
}